

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  int iVar2;
  ImGuiWindow *window;
  ImDrawList *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ulong uVar6;
  int iVar7;
  ImDrawList **ppIVar8;
  int iVar9;
  ImGuiWindow *pIVar10;
  ulong uVar11;
  int n;
  ImGuiWindow *pIVar12;
  long lVar13;
  ImGuiWindow *windows_to_render_front_most [2];
  ImGuiWindow *local_38 [2];
  
  pIVar4 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xf6c,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar4->FrameCountRendered = pIVar4->FrameCount;
  (pIVar4->IO).MetricsRenderWindows = 0;
  (pIVar4->IO).MetricsRenderVertices = 0;
  (pIVar4->IO).MetricsRenderIndices = 0;
  out_list = &pIVar4->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  if ((pIVar4->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar4->BackgroundDrawList);
  }
  pIVar10 = pIVar4->NavWindowingTarget;
  if ((pIVar10 == (ImGuiWindow *)0x0) || ((pIVar10->Flags & 0x2000) != 0)) {
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar12 = pIVar10->RootWindow;
  }
  local_38[0] = pIVar12;
  if (pIVar10 == (ImGuiWindow *)0x0) {
    pIVar10 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar10 = pIVar4->NavWindowingList;
  }
  local_38[1] = pIVar10;
  uVar1 = (pIVar4->Windows).Size;
  uVar6 = (ulong)uVar1;
  if (uVar1 != 0) {
    uVar11 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar11) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                      ,0x4d7,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (pIVar4->Windows).Data[uVar11];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar10 && window != pIVar12) && (window->Flags & 0x1000000) == 0)) {
        AddRootWindowToDrawData(window);
      }
      uVar11 = uVar11 + 1;
      uVar6 = (ulong)(uint)(pIVar4->Windows).Size;
    } while (uVar11 != uVar6);
  }
  lVar13 = 0;
  do {
    pIVar10 = local_38[lVar13];
    if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->Active == true)) && (pIVar10->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar10);
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 == 1);
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((pIVar4->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&pIVar4->ForegroundDrawList,(pIVar4->IO).MousePos,
                      (pIVar4->Style).MouseCursorScale,pIVar4->MouseCursor);
  }
  if ((pIVar4->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&pIVar4->ForegroundDrawList);
  }
  pIVar5 = GImGui;
  if (GImGui != (ImGuiContext *)0x0) {
    (pIVar4->DrawData).Valid = true;
    iVar2 = (pIVar4->DrawDataBuilder).Layers[0].Size;
    if ((long)iVar2 < 1) {
      ppIVar8 = (ImDrawList **)0x0;
    }
    else {
      ppIVar8 = (pIVar4->DrawDataBuilder).Layers[0].Data;
    }
    (pIVar4->DrawData).CmdLists = ppIVar8;
    (pIVar4->DrawData).CmdListsCount = iVar2;
    (pIVar4->DrawData).TotalIdxCount = 0;
    (pIVar4->DrawData).TotalVtxCount = 0;
    (pIVar4->DrawData).DisplayPos.x = 0.0;
    (pIVar4->DrawData).DisplayPos.y = 0.0;
    (pIVar4->DrawData).DisplaySize = (pIVar5->IO).DisplaySize;
    (pIVar4->DrawData).FramebufferScale = (pIVar5->IO).DisplayFramebufferScale;
    if (0 < iVar2) {
      iVar7 = (pIVar4->DrawData).TotalIdxCount;
      iVar9 = (pIVar4->DrawData).TotalVtxCount;
      lVar13 = 0;
      do {
        pIVar3 = (pIVar4->DrawDataBuilder).Layers[0].Data[lVar13];
        iVar9 = iVar9 + (pIVar3->VtxBuffer).Size;
        iVar7 = iVar7 + (pIVar3->IdxBuffer).Size;
        lVar13 = lVar13 + 1;
      } while (iVar2 != lVar13);
      (pIVar4->DrawData).TotalVtxCount = iVar9;
      (pIVar4->DrawData).TotalIdxCount = iVar7;
    }
    uVar6._0_4_ = (pIVar4->DrawData).TotalIdxCount;
    uVar6._4_4_ = (pIVar4->DrawData).TotalVtxCount;
    uVar6 = uVar6 << 0x20 | uVar6 >> 0x20;
    (pIVar4->IO).MetricsRenderVertices = (int)uVar6;
    (pIVar4->IO).MetricsRenderIndices = (int)(uVar6 >> 0x20);
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                ,0xc10,"ImGuiIO &ImGui::GetIO()");
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddRootWindowToDrawData(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}